

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRowViolation(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *maxviol,
                 number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *sumviol)

{
  bool bVar1;
  undefined1 uVar2;
  type_conflict5 tVar3;
  pointer in_RDX;
  pointer in_RSI;
  long in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  viol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  int i;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  activity;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *primal;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  undefined8 in_stack_fffffffffffffd88;
  int p_dimen;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd98;
  undefined6 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda6;
  double in_stack_fffffffffffffe00;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffe08;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1ec;
  SPxOut local_1b4 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_17c;
  int local_144;
  DataKey *local_140;
  undefined8 local_138 [3];
  undefined1 local_120 [24];
  double local_108;
  pointer local_100;
  pointer local_f8;
  byte local_e1;
  pointer local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  pointer local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  pointer local_b8;
  DataKey **local_b0;
  pointer local_a8;
  DataKey **local_a0;
  undefined8 *local_98;
  pointer local_90;
  undefined8 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  SPxOut *local_78;
  element_type *local_70;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_68;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_60;
  SPxOut *local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  p_dimen = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_100 = in_RDX;
  local_f8 = in_RSI;
  bVar1 = isPrimalFeasible((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  if (bVar1) {
    _syncRealSolution((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    local_108 = (double)(in_RDI + 0x5b88);
    numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x478a77);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),p_dimen);
    (**(code **)(**(long **)(in_RDI + 0x29d8) + 0x230))
              (*(long **)(in_RDI + 0x29d8),local_108,local_120,1);
    local_138[0]._0_4_ = 0;
    local_138[0]._4_4_ = 0;
    local_90 = local_f8;
    local_98 = local_138;
    local_88 = local_98;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    local_140 = (DataKey *)0x0;
    local_a8 = local_100;
    local_b0 = &local_140;
    local_a0 = local_b0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    local_144 = numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x478b73);
    while (local_144 = local_144 + -1, -1 < local_144) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lhsUnscaled(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rhsUnscaled(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
      local_38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                              in_stack_fffffffffffffd7c);
      local_30 = &local_17c;
      local_28 = &local_1ec;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,local_30,local_38);
      local_20 = &local_1ec;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
      local_10 = local_30;
      local_18 = local_38;
      local_8 = &local_1ec;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 (cpp_dec_float<50U,_int,_void> *)0x478c9b);
      uVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                         (double *)0x478cc0);
      if ((bool)uVar2) {
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)
                                ),(self_type *)in_stack_fffffffffffffd98);
        in_stack_fffffffffffffda6 =
             boost::multiprecision::operator>
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)0x478cff);
        if ((bool)in_stack_fffffffffffffda6) {
          local_b8 = local_f8;
          local_c0 = &local_1ec;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        }
      }
      local_70 = (element_type *)
                 VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                              in_stack_fffffffffffffd7c);
      in_stack_fffffffffffffd98 =
           (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)&stack0xfffffffffffffdd0;
      local_78 = local_1b4;
      local_68 = in_stack_fffffffffffffd98;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_79,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_70,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_78);
      local_60 = in_stack_fffffffffffffd98;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
      local_50 = local_70;
      local_58 = local_78;
      local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffffd98;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 (cpp_dec_float<50U,_int,_void> *)0x478e2d);
      local_d8 = &local_1ec;
      local_e0 = (pointer)&stack0xfffffffffffffdd0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                         (double *)0x478e80);
      in_stack_fffffffffffffd94 = CONCAT13(tVar3,(int3)in_stack_fffffffffffffd94);
      if (tVar3) {
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)
                                ),(self_type *)in_stack_fffffffffffffd98);
        in_stack_fffffffffffffd87 =
             boost::multiprecision::operator>
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)0x478ebc);
        if ((bool)in_stack_fffffffffffffd87) {
          local_c8 = local_f8;
          local_d0 = &local_1ec;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        }
      }
    }
    local_e1 = 1;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x478f30);
  }
  else {
    local_e1 = 0;
  }
  return (bool)(local_e1 & 1);
}

Assistant:

bool SoPlexBase<R>::getRowViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   VectorBase<R> activity(numRows());
   _realLP->computePrimalActivity(primal, activity, true);
   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numRows() - 1; i >= 0; i--)
   {
      R lhs = _realLP->lhsUnscaled(i);
      R rhs = _realLP->rhsUnscaled(i);

      R viol = lhs - activity[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = activity[i] - rhs;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}